

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O0

bool EV_DoCeiling(ECeiling type,line_t_conflict *line,int tag,double speed,double speed2,
                 double height,int crush,int silent,int change,ECrushMode hexencrush)

{
  bool bVar1;
  uint tag_00;
  int iVar2;
  FSectorTagIterator local_60;
  FSectorTagIterator it;
  sector_t *sec;
  bool rtn;
  int secnum;
  int change_local;
  int silent_local;
  int crush_local;
  double height_local;
  double speed2_local;
  double speed_local;
  int tag_local;
  line_t_conflict *line_local;
  ECeiling type_local;
  
  line_local._7_1_ = false;
  if (tag == 0) {
    if ((line == (line_t_conflict *)0x0) ||
       (it = (FSectorTagIterator)line->backsector, it == (FSectorTagIterator)0x0)) {
      line_local._7_1_ = false;
    }
    else {
      tag_00 = (uint)(((long)it - (long)sectors) / 0x218) | 0x1000000;
      P_ActivateInStasisCeiling(tag_00);
      line_local._7_1_ =
           P_CreateCeiling((sector_t *)it,type,line,tag_00,speed,speed2,height,crush,silent,change,
                           hexencrush);
    }
  }
  else {
    if (type == ceilCrushAndRaise) {
      P_ActivateInStasisCeiling(tag);
    }
    FSectorTagIterator::FSectorTagIterator(&local_60,tag);
    while (iVar2 = FSectorTagIterator::Next(&local_60), -1 < iVar2) {
      bVar1 = P_CreateCeiling((sector_t *)(sectors + iVar2),type,line,tag,speed,speed2,height,crush,
                              silent,change,hexencrush);
      line_local._7_1_ = line_local._7_1_ != false || bVar1;
    }
  }
  return line_local._7_1_;
}

Assistant:

bool EV_DoCeiling (DCeiling::ECeiling type, line_t *line,
				   int tag, double speed, double speed2, double height,
				   int crush, int silent, int change, DCeiling::ECrushMode hexencrush)
{
	int 		secnum;
	bool 		rtn;
	sector_t*	sec;
		
	rtn = false;

	// check if a manual trigger, if so do just the sector on the backside
	if (tag == 0)
	{
		if (!line || !(sec = line->backsector))
			return rtn;
		secnum = (int)(sec-sectors);
		// [RH] Hack to let manual crushers be retriggerable, too
		tag ^= secnum | 0x1000000;
		P_ActivateInStasisCeiling (tag);
		return P_CreateCeiling(sec, type, line, tag, speed, speed2, height, crush, silent, change, hexencrush);
	}
	
	//	Reactivate in-stasis ceilings...for certain types.
	// This restarts a crusher after it has been stopped
	if (type == DCeiling::ceilCrushAndRaise)
	{
		P_ActivateInStasisCeiling (tag);
	}

	// affects all sectors with the same tag as the linedef
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		rtn |= P_CreateCeiling(&sectors[secnum], type, line, tag, speed, speed2, height, crush, silent, change, hexencrush);
	}
	return rtn;
}